

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O1

void __thiscall
efsw::DirectorySnapshot::DirectorySnapshot(DirectorySnapshot *this,string *directory)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  FileInfo::FileInfo(&this->DirectoryInfo);
  p_Var1 = &(this->Files)._M_t._M_impl.super__Rb_tree_header;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar2 = (directory->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar2,pcVar2 + directory->_M_string_length);
  init(this,(EVP_PKEY_CTX *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

DirectorySnapshot::DirectorySnapshot( std::string directory ) {
	init( directory );
}